

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCircuit.hpp
# Opt level: O3

void __thiscall
qclab::QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_>::apply
          (QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *this,Side side,
          Op op,int nbQubits,SquareMatrix<std::complex<double>_> *matrix,int offset)

{
  QObject<std::complex<double>_> *pQVar1;
  __normal_iterator<const_std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>_>
  __tmp;
  pointer puVar2;
  
  if (op == NoTrans) {
    if (side == Left) {
      for (puVar2 = (this->gates_).
                    super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          puVar2 != (this->gates_).
                    super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; puVar2 = puVar2 + -1) {
        pQVar1 = puVar2[-1]._M_t.
                 super___uniq_ptr_impl<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_qclab::QObject<std::complex<double>_>_*,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
                 .super__Head_base<0UL,_qclab::QObject<std::complex<double>_>_*,_false>._M_head_impl
        ;
        (*pQVar1->_vptr_QObject[9])
                  (pQVar1,0x4c,0x4e,(ulong)(uint)nbQubits,matrix,
                   (ulong)(uint)(this->offset_ + offset));
      }
    }
    else {
      puVar2 = (this->gates_).
               super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (puVar2 != (this->gates_).
                    super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          pQVar1 = (puVar2->_M_t).
                   super___uniq_ptr_impl<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_qclab::QObject<std::complex<double>_>_*,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
                   .super__Head_base<0UL,_qclab::QObject<std::complex<double>_>_*,_false>.
                   _M_head_impl;
          (*pQVar1->_vptr_QObject[9])
                    (pQVar1,(ulong)(uint)(int)(char)side,0x4e,(ulong)(uint)nbQubits,matrix,
                     (ulong)(uint)(this->offset_ + offset));
          puVar2 = puVar2 + 1;
        } while (puVar2 != (this->gates_).
                           super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
  }
  else if (side == Left) {
    puVar2 = (this->gates_).
             super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (puVar2 != (this->gates_).
                  super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        pQVar1 = (puVar2->_M_t).
                 super___uniq_ptr_impl<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_qclab::QObject<std::complex<double>_>_*,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
                 .super__Head_base<0UL,_qclab::QObject<std::complex<double>_>_*,_false>._M_head_impl
        ;
        (*pQVar1->_vptr_QObject[9])
                  (pQVar1,0x4c,(ulong)(uint)(int)(char)op,(ulong)(uint)nbQubits,matrix,
                   (ulong)(uint)(this->offset_ + offset));
        puVar2 = puVar2 + 1;
      } while (puVar2 != (this->gates_).
                         super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  else {
    puVar2 = (this->gates_).
             super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar2 != (this->gates_).
                  super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      do {
        pQVar1 = puVar2[-1]._M_t.
                 super___uniq_ptr_impl<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_qclab::QObject<std::complex<double>_>_*,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
                 .super__Head_base<0UL,_qclab::QObject<std::complex<double>_>_*,_false>._M_head_impl
        ;
        puVar2 = puVar2 + -1;
        (*pQVar1->_vptr_QObject[9])
                  (pQVar1,(ulong)(uint)(int)(char)side,(ulong)(uint)(int)(char)op,
                   (ulong)(uint)nbQubits,matrix,(ulong)(uint)(this->offset_ + offset));
      } while (puVar2 != (this->gates_).
                         super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void apply( Side side , Op op , const int nbQubits ,
                  qclab::dense::SquareMatrix< T >& matrix ,
                  const int offset = 0 ) const override {
        if ( op == Op::NoTrans ) {
          if ( side == Side::Left ) {
            // Left + NoTrans
            for ( auto it = rbegin(); it != rend(); ++it ) {
              (*it)->apply( side , op , nbQubits , matrix , offset_ + offset ) ;
            }
          } else {
            // Right + NoTrans
            for ( auto it = begin(); it != end(); ++it ) {
              (*it)->apply( side , op , nbQubits , matrix , offset_ + offset ) ;
            }
          }
        } else {
          if ( side == Side::Left ) {
            // Left + [Conj]Trans
            for ( auto it = begin(); it != end(); ++it ) {
              (*it)->apply( side , op , nbQubits , matrix , offset_ + offset ) ;
            }
          } else {
            // Right + [Conj]Trans
            for ( auto it = rbegin(); it != rend(); ++it ) {
              (*it)->apply( side , op , nbQubits , matrix , offset_ + offset ) ;
            }
          }
        }
      }